

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_auth(Curl_easy *data,char *mech,bufref *initresp)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  uchar *puVar1;
  char *ir;
  smtp_conn *smtpc;
  CURLcode result;
  bufref *initresp_local;
  char *mech_local;
  Curl_easy *data_local;
  
  pp = &data->conn->proto;
  puVar1 = Curl_bufref_ptr(initresp);
  if (puVar1 == (uchar *)0x0) {
    smtpc._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",mech);
  }
  else {
    smtpc._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s %s",mech,puVar1);
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_perform_auth(struct Curl_easy *data,
                                  const char *mech,
                                  const struct bufref *initresp)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &data->conn->proto.smtpc;
  const char *ir = (const char *) Curl_bufref_ptr(initresp);

  if(ir) {                                  /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(data, &smtpc->pp, "AUTH %s %s", mech, ir);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(data, &smtpc->pp, "AUTH %s", mech);
  }

  return result;
}